

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_updateconninfo(connectdata *conn,curl_socket_t sockfd)

{
  uint uVar1;
  Curl_easy *data_00;
  _Bool _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  int *piVar6;
  int error_1;
  int error;
  curl_socklen_t len;
  Curl_sockaddr_storage ssloc;
  Curl_sockaddr_storage ssrem;
  char buffer [128];
  Curl_easy *data;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  if (conn->socktype == 2) {
    return;
  }
  if (((*(uint *)&(conn->bits).field_0x4 >> 1 & 1) == 0) &&
     ((*(uint *)&(conn->bits).field_0x4 >> 0x1b & 1) == 0)) {
    data_00 = conn->data;
    error_1 = 0x80;
    iVar3 = getpeername(sockfd,(sockaddr *)((long)&ssloc.buffer + 0x78),(socklen_t *)&error_1);
    if (iVar3 != 0) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar5 = Curl_strerror(uVar1,(char *)&ssrem.buffer.sa_stor.__ss_align,0x80);
      Curl_failf(data_00,"getpeername() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
    error_1 = 0x80;
    memset(&error,0,0x80);
    iVar3 = getsockname(sockfd,(sockaddr *)&error,(socklen_t *)&error_1);
    if (iVar3 != 0) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar5 = Curl_strerror(uVar1,(char *)&ssrem.buffer.sa_stor.__ss_align,0x80);
      Curl_failf(data_00,"getsockname() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
    _Var2 = getaddressinfo((sockaddr *)((long)&ssloc.buffer + 0x78),conn->primary_ip,
                           &conn->primary_port);
    if (!_Var2) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar6 = __errno_location();
      pcVar5 = Curl_strerror(*piVar6,(char *)&ssrem.buffer.sa_stor.__ss_align,0x80);
      Curl_failf(data_00,"ssrem inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
    memcpy(conn->ip_addr_str,conn->primary_ip,0x2e);
    _Var2 = getaddressinfo((sockaddr *)&error,conn->local_ip,&conn->local_port);
    if (!_Var2) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      piVar6 = __errno_location();
      pcVar5 = Curl_strerror(*piVar6,(char *)&ssrem.buffer.sa_stor.__ss_align,0x80);
      Curl_failf(data_00,"ssloc inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
  }
  Curl_persistconninfo(conn);
  return;
}

Assistant:

void Curl_updateconninfo(struct connectdata *conn, curl_socket_t sockfd)
{
  if(conn->socktype == SOCK_DGRAM)
    /* there's no connection! */
    return;

#if defined(HAVE_GETPEERNAME) || defined(HAVE_GETSOCKNAME)
  if(!conn->bits.reuse && !conn->bits.tcp_fastopen) {
    struct Curl_easy *data = conn->data;
    char buffer[STRERROR_LEN];
    struct Curl_sockaddr_storage ssrem;
    struct Curl_sockaddr_storage ssloc;
    curl_socklen_t len;
#ifdef HAVE_GETPEERNAME
    len = sizeof(struct Curl_sockaddr_storage);
    if(getpeername(sockfd, (struct sockaddr*) &ssrem, &len)) {
      int error = SOCKERRNO;
      failf(data, "getpeername() failed with errno %d: %s",
            error, Curl_strerror(error, buffer, sizeof(buffer)));
      return;
    }
#endif
#ifdef HAVE_GETSOCKNAME
    len = sizeof(struct Curl_sockaddr_storage);
    memset(&ssloc, 0, sizeof(ssloc));
    if(getsockname(sockfd, (struct sockaddr*) &ssloc, &len)) {
      int error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(error, buffer, sizeof(buffer)));
      return;
    }
#endif
#ifdef HAVE_GETPEERNAME
    if(!getaddressinfo((struct sockaddr*)&ssrem,
                       conn->primary_ip, &conn->primary_port)) {
      failf(data, "ssrem inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(errno, buffer, sizeof(buffer)));
      return;
    }
    memcpy(conn->ip_addr_str, conn->primary_ip, MAX_IPADR_LEN);
#endif
#ifdef HAVE_GETSOCKNAME
    if(!getaddressinfo((struct sockaddr*)&ssloc,
                       conn->local_ip, &conn->local_port)) {
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(errno, buffer, sizeof(buffer)));
      return;
    }
#endif
  }
#else /* !HAVE_GETSOCKNAME && !HAVE_GETPEERNAME */
  (void)sockfd; /* unused */
#endif

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);
}